

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O1

void __thiscall sznet::net::Acceptor::~Acceptor(Acceptor *this)

{
  Channel *this_00;
  _Manager_type p_Var1;
  char *in_RSI;
  
  this_00 = &this->m_acceptChannel;
  (this->m_acceptChannel).m_events = 0;
  Channel::update(this_00);
  Channel::remove(this_00,in_RSI);
  sockets::sz_closesocket(this->m_idleFd);
  p_Var1 = (this->m_newConnectionCallback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_newConnectionCallback,
              (_Any_data *)&this->m_newConnectionCallback,__destroy_functor);
  }
  Channel::~Channel(this_00);
  Socket::~Socket(&this->m_acceptSocket);
  return;
}

Assistant:

Acceptor::~Acceptor()
{
	m_acceptChannel.disableAll();
	m_acceptChannel.remove();
	sockets::sz_closesocket(m_idleFd);
}